

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkBalanceExor(Abc_Ntk_t *pNtk,int fUpdateLevel,int fVerbose)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pMan_00;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtkAig;
  int fVerbose_local;
  int fUpdateLevel_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    p = Abc_NtkToDar(pNtk,1,0);
    if (p == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      if (fVerbose != 0) {
        Dar_BalancePrintStats(p);
      }
      pMan_00 = Dar_ManBalance(p,fUpdateLevel);
      pNtk_local = Abc_NtkFromDar(pNtk,pMan_00);
      Aig_ManStop(pMan_00);
      Aig_ManStop(p);
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0xfc6,"Abc_Ntk_t *Abc_NtkBalanceExor(Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBalanceExor( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose )
{
    extern void Dar_BalancePrintStats( Aig_Man_t * p );
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;//, * pTemp2;
    assert( Abc_NtkIsStrash(pNtk) );
    // derive AIG with EXORs
    pMan = Abc_NtkToDar( pNtk, 1, 0 );
    if ( pMan == NULL )
        return NULL;
//    Aig_ManPrintStats( pMan );
    if ( fVerbose )
        Dar_BalancePrintStats( pMan );
    // perform balancing
    pTemp = Dar_ManBalance( pMan, fUpdateLevel );
//    Aig_ManPrintStats( pTemp );
    // create logic network
    pNtkAig = Abc_NtkFromDar( pNtk, pTemp );
    Aig_ManStop( pTemp );
    Aig_ManStop( pMan );
    return pNtkAig;
}